

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O0

uc_err uc_mem_read(uc_engine *uc,uint64_t address,void *_bytes,size_t size)

{
  _Bool _Var1;
  MemoryRegion *mr_00;
  size_t sVar2;
  MemoryRegion *mr;
  uint8_t *puStack_48;
  int __init_ret;
  uint8_t *bytes;
  size_t len;
  size_t count;
  size_t size_local;
  void *_bytes_local;
  uint64_t address_local;
  uc_engine *uc_local;
  
  len = 0;
  if ((((uc->init_done ^ 0xffU) & 1) == 0) ||
     (uc_local._4_4_ = uc_init_engine(uc), uc_local._4_4_ == UC_ERR_OK)) {
    if (size < 0x80000000) {
      _Var1 = check_mem_area(uc,address,size);
      puStack_48 = (uint8_t *)_bytes;
      _bytes_local = (void *)address;
      if (_Var1) {
        while ((len < size &&
               (mr_00 = (*uc->memory_mapping)(uc,(hwaddr)_bytes_local), mr_00 != (MemoryRegion *)0x0
               ))) {
          sVar2 = memory_region_len(uc,mr_00,(uint64_t)_bytes_local,size - len);
          _Var1 = (*uc->read_mem)(&uc->address_space_memory,(hwaddr)_bytes_local,puStack_48,
                                  (int)sVar2);
          if (!_Var1) break;
          len = sVar2 + len;
          _bytes_local = (void *)(sVar2 + (long)_bytes_local);
          puStack_48 = puStack_48 + sVar2;
        }
        if (len == size) {
          uc_local._4_4_ = UC_ERR_OK;
        }
        else {
          uc_local._4_4_ = UC_ERR_READ_UNMAPPED;
        }
      }
      else {
        uc_local._4_4_ = UC_ERR_READ_UNMAPPED;
      }
    }
    else {
      uc_local._4_4_ = UC_ERR_ARG;
    }
  }
  return uc_local._4_4_;
}

Assistant:

UNICORN_EXPORT
uc_err uc_mem_read(uc_engine *uc, uint64_t address, void *_bytes, size_t size)
{
    size_t count = 0, len;
    uint8_t *bytes = _bytes;

    UC_INIT(uc);

    // qemu cpu_physical_memory_rw() size is an int
    if (size > INT_MAX)
        return UC_ERR_ARG;

    if (!check_mem_area(uc, address, size)) {
        return UC_ERR_READ_UNMAPPED;
    }

    // memory area can overlap adjacent memory blocks
    while (count < size) {
        MemoryRegion *mr = uc->memory_mapping(uc, address);
        if (mr) {
            len = memory_region_len(uc, mr, address, size - count);
            if (uc->read_mem(&uc->address_space_memory, address, bytes, len) ==
                false) {
                break;
            }
            count += len;
            address += len;
            bytes += len;
        } else { // this address is not mapped in yet
            break;
        }
    }

    if (count == size) {
        return UC_ERR_OK;
    } else {
        return UC_ERR_READ_UNMAPPED;
    }
}